

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# annotator.cpp
# Opt level: O1

void __thiscall
Annotator_getItemBySpecificTypeDuplicateId_Test::~Annotator_getItemBySpecificTypeDuplicateId_Test
          (Annotator_getItemBySpecificTypeDuplicateId_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Annotator, getItemBySpecificTypeDuplicateId)
{
    auto parser = libcellml::Parser::create();
    auto annotator = libcellml::Annotator::create();
    auto model = parser->parseModel(modelStringDuplicateIds);

    EXPECT_EQ(nullptr, annotator->model("duplicateId"));
    EXPECT_EQ(size_t(1), annotator->errorCount());
    EXPECT_EQ("This Annotator object does not have a model to work with.", annotator->error(0)->description());

    EXPECT_EQ(nullptr, annotator->encapsulation("duplicateId"));
    EXPECT_EQ(size_t(1), annotator->errorCount());
    EXPECT_EQ("This Annotator object does not have a model to work with.", annotator->error(0)->description());

    EXPECT_EQ(nullptr, annotator->component("duplicateId"));
    EXPECT_EQ(size_t(1), annotator->errorCount());
    EXPECT_EQ("This Annotator object does not have a model to work with.", annotator->error(0)->description());

    EXPECT_EQ(nullptr, annotator->variable("duplicateId"));
    EXPECT_EQ(size_t(1), annotator->errorCount());
    EXPECT_EQ("This Annotator object does not have a model to work with.", annotator->error(0)->description());

    EXPECT_EQ(nullptr, annotator->units("duplicateId"));
    EXPECT_EQ(size_t(1), annotator->errorCount());
    EXPECT_EQ("This Annotator object does not have a model to work with.", annotator->error(0)->description());

    EXPECT_EQ(nullptr, annotator->unitsItem("duplicateId"));
    EXPECT_EQ(size_t(1), annotator->errorCount());
    EXPECT_EQ("This Annotator object does not have a model to work with.", annotator->error(0)->description());

    EXPECT_EQ(nullptr, annotator->reset("duplicateId"));
    EXPECT_EQ(size_t(1), annotator->errorCount());
    EXPECT_EQ("This Annotator object does not have a model to work with.", annotator->error(0)->description());

    EXPECT_EQ(nullptr, annotator->resetValue("duplicateId"));
    EXPECT_EQ(size_t(1), annotator->errorCount());
    EXPECT_EQ("This Annotator object does not have a model to work with.", annotator->error(0)->description());

    EXPECT_EQ(nullptr, annotator->testValue("duplicateId"));
    EXPECT_EQ(size_t(1), annotator->errorCount());
    EXPECT_EQ("This Annotator object does not have a model to work with.", annotator->error(0)->description());

    EXPECT_EQ(nullptr, annotator->componentEncapsulation("duplicateId"));
    EXPECT_EQ(size_t(1), annotator->errorCount());
    EXPECT_EQ("This Annotator object does not have a model to work with.", annotator->error(0)->description());

    EXPECT_EQ(nullptr, annotator->connection("duplicateId"));
    EXPECT_EQ(size_t(1), annotator->errorCount());
    EXPECT_EQ("This Annotator object does not have a model to work with.", annotator->error(0)->description());

    EXPECT_EQ(nullptr, annotator->mapVariables("duplicateId"));
    EXPECT_EQ(size_t(1), annotator->errorCount());
    EXPECT_EQ("This Annotator object does not have a model to work with.", annotator->error(0)->description());

    EXPECT_EQ(nullptr, annotator->importSource("duplicateId"));
    EXPECT_EQ(size_t(1), annotator->errorCount());
    EXPECT_EQ("This Annotator object does not have a model to work with.", annotator->error(0)->description());

    annotator->setModel(model);

    // Expect that the errors have been cleared.
    EXPECT_EQ(size_t(0), annotator->errorCount());
    EXPECT_EQ(size_t(0), annotator->warningCount());
    EXPECT_EQ(size_t(0), annotator->messageCount());

    // Cannot find unique id so no item is available.
    EXPECT_EQ(nullptr, annotator->model("duplicateId"));
    EXPECT_EQ(size_t(1), annotator->warningCount());
    EXPECT_EQ("The identifier 'duplicateId' occurs 29 times in the model so a unique item cannot be located.", annotator->warning(0)->description());

    EXPECT_EQ(nullptr, annotator->encapsulation("duplicateId"));
    EXPECT_EQ(size_t(1), annotator->warningCount());
    EXPECT_EQ("The identifier 'duplicateId' occurs 29 times in the model so a unique item cannot be located.", annotator->warning(0)->description());

    EXPECT_EQ(nullptr, annotator->component("duplicateId"));
    EXPECT_EQ(size_t(1), annotator->warningCount());
    EXPECT_EQ("The identifier 'duplicateId' occurs 29 times in the model so a unique item cannot be located.", annotator->warning(0)->description());

    EXPECT_EQ(nullptr, annotator->variable("duplicateId"));
    EXPECT_EQ(size_t(1), annotator->warningCount());
    EXPECT_EQ("The identifier 'duplicateId' occurs 29 times in the model so a unique item cannot be located.", annotator->warning(0)->description());

    EXPECT_EQ(nullptr, annotator->units("duplicateId"));
    EXPECT_EQ(size_t(1), annotator->warningCount());
    EXPECT_EQ("The identifier 'duplicateId' occurs 29 times in the model so a unique item cannot be located.", annotator->warning(0)->description());

    EXPECT_EQ(nullptr, annotator->unitsItem("duplicateId"));
    EXPECT_EQ(size_t(1), annotator->warningCount());
    EXPECT_EQ("The identifier 'duplicateId' occurs 29 times in the model so a unique item cannot be located.", annotator->warning(0)->description());

    EXPECT_EQ(nullptr, annotator->reset("duplicateId"));
    EXPECT_EQ(size_t(1), annotator->warningCount());
    EXPECT_EQ("The identifier 'duplicateId' occurs 29 times in the model so a unique item cannot be located.", annotator->warning(0)->description());

    EXPECT_EQ(nullptr, annotator->resetValue("duplicateId"));
    EXPECT_EQ(size_t(1), annotator->warningCount());
    EXPECT_EQ("The identifier 'duplicateId' occurs 29 times in the model so a unique item cannot be located.", annotator->warning(0)->description());

    EXPECT_EQ(nullptr, annotator->testValue("duplicateId"));
    EXPECT_EQ(size_t(1), annotator->warningCount());
    EXPECT_EQ("The identifier 'duplicateId' occurs 29 times in the model so a unique item cannot be located.", annotator->warning(0)->description());

    EXPECT_EQ(nullptr, annotator->componentEncapsulation("duplicateId"));
    EXPECT_EQ(size_t(1), annotator->warningCount());
    EXPECT_EQ("The identifier 'duplicateId' occurs 29 times in the model so a unique item cannot be located.", annotator->warning(0)->description());

    EXPECT_EQ(nullptr, annotator->connection("duplicateId"));
    EXPECT_EQ(size_t(1), annotator->warningCount());
    EXPECT_EQ("The identifier 'duplicateId' occurs 29 times in the model so a unique item cannot be located.", annotator->warning(0)->description());

    EXPECT_EQ(nullptr, annotator->mapVariables("duplicateId"));
    EXPECT_EQ(size_t(1), annotator->warningCount());
    EXPECT_EQ("The identifier 'duplicateId' occurs 29 times in the model so a unique item cannot be located.", annotator->warning(0)->description());

    EXPECT_EQ(nullptr, annotator->importSource("duplicateId"));
    EXPECT_EQ(size_t(1), annotator->warningCount());
    EXPECT_EQ("The identifier 'duplicateId' occurs 29 times in the model so a unique item cannot be located.", annotator->warning(0)->description());
}